

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::closePersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QWidget *pQVar2;
  QObject *pQVar3;
  QEditorInfo *pQVar4;
  long *plVar5;
  long in_FS_OFFSET;
  QWidget *editor;
  undefined8 local_60;
  quintptr local_58;
  QAbstractItemModel *local_50;
  QWidget *local_48;
  void *local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  pQVar4 = QAbstractItemViewPrivate::editorForIndex(this_00,index);
  pDVar1 = (pQVar4->widget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (QWidget *)(pQVar4->widget).wp.value, local_48 = pQVar2, pQVar2 != (QWidget *)0x0)) {
    QItemSelectionModel::currentIndex();
    if (((index->r == (int)local_60) && (index->c == local_60._4_4_)) &&
       ((index->i == local_58 && ((index->m).ptr == local_50)))) {
      (**(code **)(*(long *)this + 0x290))(this,pQVar2,4);
    }
    QHash<QWidget*,QHashDummyValue>::removeImpl<QWidget*>
              ((QHash<QWidget*,QHashDummyValue> *)&this_00->persistent,&local_48);
    QAbstractItemViewPrivate::removeEditor(this_00,local_48);
    pQVar2 = local_48;
    if (local_48 != (QWidget *)0x0) {
      pQVar3 = *(QObject **)
                &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                 super_QWidgetPrivate.field_0x8;
      local_60 = QObject::destroyed;
      local_58 = 0;
      local_40 = (void *)0x2a1;
      local_38 = 0;
      QObject::disconnectImpl
                (&local_48->super_QObject,(void **)&local_60,pQVar3,&local_40,
                 (QMetaObject *)&QObject::staticMetaObject);
      QObject::removeEventFilter(&pQVar2->super_QObject);
      QWidget::hide(pQVar2);
      plVar5 = (long *)(**(code **)(*(long *)pQVar3 + 0x208))(pQVar3,index);
      if (plVar5 == (long *)0x0) {
        QObject::deleteLater();
      }
      else {
        (**(code **)(*plVar5 + 0x78))(plVar5,pQVar2,index);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::closePersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (QWidget *editor = d->editorForIndex(index).widget.data()) {
        if (index == selectionModel()->currentIndex())
            closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
        d->persistent.remove(editor);
        d->removeEditor(editor);
        d->releaseEditor(editor, index);
    }
}